

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O3

result<in6_addr> *
sockpp::inet6_address::resolve_name(result<in6_addr> *__return_storage_ptr__,string *saddr)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  error_category *peVar4;
  addrinfo *res;
  in6_addr ia;
  addrinfo hints;
  addrinfo *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  addrinfo local_48;
  
  iVar2 = inet_pton(10,(saddr->_M_dataplus)._M_p,&local_58);
  if (iVar2 == 1) {
    *(undefined8 *)&(__return_storage_ptr__->val_).__in6_u = local_58;
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).__in6_u + 8) = uStack_50;
  }
  else {
    local_48.ai_flags = 0;
    local_48.ai_protocol = 0;
    local_48.ai_canonname = (char *)0x0;
    local_48.ai_next = (addrinfo *)0x0;
    local_48.ai_addrlen = 0;
    local_48._20_4_ = 0;
    local_48.ai_addr = (sockaddr *)0x0;
    local_48.ai_family = 10;
    local_48.ai_socktype = 1;
    iVar2 = getaddrinfo((saddr->_M_dataplus)._M_p,(char *)0x0,&local_48,&local_60);
    if (iVar2 != 0) {
      if (iVar2 == -0xb) {
        piVar3 = __errno_location();
        iVar2 = *piVar3;
        peVar4 = (error_category *)std::_V2::system_category();
      }
      else {
        peVar4 = &gai_errc_category()->super_error_category;
      }
      *(undefined8 *)&(__return_storage_ptr__->val_).__in6_u = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->val_).__in6_u + 8) = 0;
      (__return_storage_ptr__->err_)._M_value = iVar2;
      goto LAB_00107a19;
    }
    uVar1 = *(undefined8 *)(local_60->ai_addr + 1);
    *(undefined8 *)&(__return_storage_ptr__->val_).__in6_u =
         *(undefined8 *)(local_60->ai_addr->sa_data + 6);
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).__in6_u + 8) = uVar1;
    freeaddrinfo(local_60);
  }
  (__return_storage_ptr__->err_)._M_value = 0;
  peVar4 = (error_category *)std::_V2::system_category();
LAB_00107a19:
  (__return_storage_ptr__->err_)._M_cat = peVar4;
  return __return_storage_ptr__;
}

Assistant:

result<in6_addr> inet6_address::resolve_name(const string& saddr) noexcept {
#if !defined(_WIN32)
    in6_addr ia;
    if (::inet_pton(ADDRESS_FAMILY, saddr.c_str(), &ia) == 1)
        return ia;
#endif

    addrinfo *res, hints = addrinfo{};
    hints.ai_family = ADDRESS_FAMILY;
    hints.ai_socktype = SOCK_STREAM;

    int err = ::getaddrinfo(saddr.c_str(), NULL, &hints, &res);

    if (err != 0) {
        error_code ec{};
#if defined(_WIN32)
        ec = error_code{errno, system_category()};
#else
        if (err == EAI_SYSTEM)
            ec = result<>::last_error();
        else
            ec = make_error_code(static_cast<gai_errc>(err));
#endif
        return ec;
    }

    auto ipv6 = reinterpret_cast<sockaddr_in6*>(res->ai_addr);
    auto addr = ipv6->sin6_addr;
    freeaddrinfo(res);
    return addr;
}